

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O2

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::update(COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
         *this)

{
  ECOLOR_FORMAT EVar1;
  undefined4 uVar2;
  uint uVar3;
  ITexture *pIVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  code *UNRECOVERED_JUMPTABLE;
  int iVar9;
  long lVar10;
  uint uVar11;
  undefined8 uVar12;
  u32 i;
  ulong uVar13;
  double in_XMM0_Qa;
  
  if (this->RequestTextureUpdate == false) {
    bVar5 = this->RequestDepthStencilUpdate;
    if ((bool)bVar5 == false) {
      return;
    }
  }
  else {
    uVar7 = (ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                          super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_IRenderTarget).Textures.m_data.
                         super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar13 = (ulong)(*(long *)&(this->super_IRenderTarget).field_0x60 -
                    *(long *)&(this->super_IRenderTarget).field_0x58) >> 2;
    if ((uint)uVar7 < (uint)uVar13) {
      uVar13 = uVar7;
    }
    uVar13 = uVar13 & 0xffffffff;
    for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
      pIVar4 = (this->super_IRenderTarget).Textures.m_data.
               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      if (pIVar4 == (ITexture *)0x0) {
        lVar8 = *(long *)&(this->super_IRenderTarget).field_0x58;
LAB_00204043:
        if (*(int *)(lVar8 + uVar7 * 4) != 0) {
          *(undefined4 *)(lVar8 + uVar7 * 4) = 0;
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            in_XMM0_Qa = (double)(*UNRECOVERED_JUMPTABLE)(0x8d40,0,0xde1,0);
          }
          in_XMM0_Qa = os::Printer::log((Printer *)"Error: Could not set render target.",in_XMM0_Qa)
          ;
        }
      }
      else {
        lVar8 = *(long *)&(this->super_IRenderTarget).field_0x58;
        if (*(int *)&pIVar4->field_0x84 == 0) goto LAB_00204043;
        *(int *)(lVar8 + uVar7 * 4) = (int)(uVar7 + 0x8ce0);
        if (pIVar4->Type == ETT_2D) {
          iVar9 = 0xde1;
        }
        else {
          iVar9 = (this->super_IRenderTarget).CubeSurfaces.m_data.
                  super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7] + 0x8515;
        }
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          in_XMM0_Qa = (double)(*UNRECOVERED_JUMPTABLE)(0x8d40,uVar7 + 0x8ce0,iVar9);
        }
      }
    }
    lVar8 = *(long *)&(this->super_IRenderTarget).field_0x58;
    for (; uVar13 < ((ulong)(*(long *)&(this->super_IRenderTarget).field_0x60 - lVar8) >> 2 &
                    0xffffffff); uVar13 = uVar13 + 1) {
      iVar9 = *(int *)(lVar8 + uVar13 * 4);
      if (iVar9 != 0) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,iVar9,0xde1,0);
          lVar8 = *(long *)&(this->super_IRenderTarget).field_0x58;
        }
        *(undefined4 *)(lVar8 + uVar13 * 4) = 0;
      }
    }
    this->RequestTextureUpdate = false;
    bVar5 = this->RequestDepthStencilUpdate;
  }
  if ((bVar5 & 1) != 0) {
    pIVar4 = (this->super_IRenderTarget).DepthStencil;
    if ((pIVar4 == (ITexture *)0x0) || (EVar1 = pIVar4->ColorFormat, 2 < EVar1 - ECF_D16)) {
      if (this->AssignedDepth == true) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d00,0xde1,0,0);
        }
      }
      if (this->AssignedStencil == true) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,0,0);
        }
      }
      this->AssignedDepth = false;
      this->AssignedStencil = false;
    }
    else {
      uVar2 = *(undefined4 *)&pIVar4->field_0x84;
      UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
      if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
         (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d00,0xde1,uVar2,0);
      }
      if (EVar1 == ECF_D24S8) {
        UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
        if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
           (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
           UNRECOVERED_JUMPTABLE != (code *)0x0)) {
          (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,uVar2,0);
        }
        this->AssignedStencil = true;
      }
      else {
        if (this->AssignedStencil == true) {
          UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x918;
          if ((UNRECOVERED_JUMPTABLE != (code *)0x0) ||
             (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x970,
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            (*UNRECOVERED_JUMPTABLE)(0x8d40,0x8d20,0xde1,0,0);
          }
        }
        this->AssignedStencil = false;
      }
      this->AssignedDepth = true;
    }
    this->RequestDepthStencilUpdate = false;
  }
  if ((this->ColorAttachment == 0) || (this->BufferID == 0)) {
    return;
  }
  uVar6 = (uint)((ulong)((long)(this->super_IRenderTarget).Textures.m_data.
                               super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->super_IRenderTarget).Textures.m_data.
                              super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (uVar6 != 1) {
    if (uVar6 == 0) {
      uVar12 = 0;
      goto LAB_00204335;
    }
    uVar3 = this->MultipleRenderTarget;
    if (uVar3 != 0) {
      lVar8 = *(long *)&(this->super_IRenderTarget).field_0x58;
      uVar13 = *(long *)&(this->super_IRenderTarget).field_0x60 - lVar8;
      lVar10 = 0;
      if (uVar13 != 0) {
        lVar10 = lVar8;
      }
      uVar11 = (uint)(uVar13 >> 2);
      if (uVar6 < uVar11) {
        uVar11 = uVar6;
      }
      if (uVar3 < uVar11) {
        uVar11 = uVar3;
      }
      UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x9b0;
      if ((UNRECOVERED_JUMPTABLE == (code *)0x0) &&
         (UNRECOVERED_JUMPTABLE = *(code **)&this->Driver->field_0x9b8,
         UNRECOVERED_JUMPTABLE == (code *)0x0)) {
        return;
      }
      (*UNRECOVERED_JUMPTABLE)(uVar11,lVar10);
      return;
    }
  }
  uVar12 = 0x8ce0;
LAB_00204335:
  glDrawBuffer(uVar12);
  return;
}

Assistant:

void update()
	{
		if (RequestTextureUpdate || RequestDepthStencilUpdate) {
			// Set color attachments.

			if (RequestTextureUpdate) {
				// Set new color textures.

				const u32 textureSize = core::min_(Textures.size(), AssignedTextures.size());

				for (u32 i = 0; i < textureSize; ++i) {
					TOpenGLTexture *currentTexture = static_cast<TOpenGLTexture *>(Textures[i]);
					GLuint textureID = currentTexture ? currentTexture->getOpenGLTextureName() : 0;

					if (textureID != 0) {
						AssignedTextures[i] = GL_COLOR_ATTACHMENT0 + i;
						GLenum textarget = currentTexture->getType() == ETT_2D ? GL_TEXTURE_2D : GL_TEXTURE_CUBE_MAP_POSITIVE_X + (int)CubeSurfaces[i];
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], textarget, textureID, 0);
#ifdef _DEBUG
						Driver->testGLError(__LINE__);
#endif
					} else if (AssignedTextures[i] != GL_NONE) {
						AssignedTextures[i] = GL_NONE;
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);

						os::Printer::log("Error: Could not set render target.", ELL_ERROR);
					}
				}

				// Reset other render target channels.

				for (u32 i = textureSize; i < AssignedTextures.size(); ++i) {
					if (AssignedTextures[i] != GL_NONE) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, AssignedTextures[i], GL_TEXTURE_2D, 0, 0);
						AssignedTextures[i] = GL_NONE;
					}
				}

				RequestTextureUpdate = false;
			}

			// Set depth and stencil attachments.

			if (RequestDepthStencilUpdate) {
				const ECOLOR_FORMAT textureFormat = (DepthStencil) ? DepthStencil->getColorFormat() : ECF_UNKNOWN;

				if (IImage::isDepthFormat(textureFormat)) {
					GLuint textureID = static_cast<TOpenGLTexture *>(DepthStencil)->getOpenGLTextureName();

#ifdef _IRR_EMSCRIPTEN_PLATFORM_ // The WEBGL_depth_texture extension does not allow attaching stencil+depth separate.
					if (textureFormat == ECF_D24S8) {
						GLenum attachment = 0x821A; // GL_DEPTH_STENCIL_ATTACHMENT
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = true;
					} else {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);
						AssignedStencil = false;
					}
#else
					Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

					if (textureFormat == ECF_D24S8) {
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, textureID, 0);

						AssignedStencil = true;
					} else {
						if (AssignedStencil)
							Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

						AssignedStencil = false;
					}
#endif
					AssignedDepth = true;
				} else {
					if (AssignedDepth)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					if (AssignedStencil)
						Driver->irrGlFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, 0, 0);

					AssignedDepth = false;
					AssignedStencil = false;
				}
#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif

				RequestDepthStencilUpdate = false;
			}

			// Configure drawing operation.

			if (ColorAttachment > 0 && BufferID != 0) {
				const u32 textureSize = Textures.size();

				if (textureSize == 0)
					Driver->irrGlDrawBuffer(GL_NONE);
				else if (textureSize == 1 || MultipleRenderTarget == 0)
					Driver->irrGlDrawBuffer(GL_COLOR_ATTACHMENT0);
				else {
					const u32 bufferCount = core::min_(MultipleRenderTarget, core::min_(textureSize, AssignedTextures.size()));

					Driver->irrGlDrawBuffers(bufferCount, AssignedTextures.pointer());
				}

#ifdef _DEBUG
				Driver->testGLError(__LINE__);
#endif
			}

#ifdef _DEBUG
			checkFBO(Driver);
#endif
		}
	}